

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexMCMC.h
# Opt level: O2

Estimates * VertexMCMC(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  long lVar1;
  EdgeIdx *pEVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  CGraph *this;
  uint uVar6;
  double dVar7;
  result_type rVar8;
  result_type rVar9;
  size_type __n;
  size_type sVar10;
  difference_type dVar11;
  difference_type dVar12;
  long lVar13;
  long lVar14;
  size_type sVar15;
  long lVar16;
  size_type __n_00;
  mt19937 *pmVar17;
  unsigned_long *puVar18;
  Estimates *pEVar19;
  size_type __n_01;
  long lVar20;
  byte bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  reference rVar25;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  unsigned_long auStack_3d58 [626];
  byte local_29c1;
  double local_29c0;
  EdgeIdx local_29b8;
  size_type local_29b0;
  double local_29a8;
  CGraph *local_29a0;
  Estimates *local_2998;
  size_type local_2990;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  uniform_int_distribution<long> dist_parent_nbor;
  uniform_int_distribution<long> dist_nbor;
  vector<bool,_std::allocator<bool>_> local_28b8;
  vector<bool,_std::allocator<bool>_> local_2890;
  VertexIdx local_2868;
  OrderedEdgeCollection local_2860;
  Parameters local_27e8;
  mt19937 mt;
  random_device rd;
  
  bVar21 = 0;
  local_29b0 = cg->nVertices;
  local_2990 = cg->nEdges;
  local_29b8 = params->walk_length;
  dVar7 = (double)*(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_2998 = __return_storage_ptr__;
  std::random_device::random_device(&rd);
  uVar6 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar6);
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dist_nbor._M_param._M_a = dist_nbor._M_param._M_a & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_vertex_set,local_29b0,(bool *)&dist_nbor,(allocator_type *)&visited_edge_set);
  dist_nbor._M_param._M_a = dist_nbor._M_param._M_a & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited_edge_set,local_2990,(bool *)&dist_nbor,(allocator_type *)&dist_parent_nbor);
  if (cg->offsets[(long)dVar7 + 1] == cg->offsets[(long)dVar7]) {
    pmVar17 = &mt;
    puVar18 = auStack_3d58;
    for (lVar13 = 0x271; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar18 = pmVar17->_M_x[0];
      pmVar17 = (mt19937 *)((long)pmVar17 + (ulong)bVar21 * -0x10 + 8);
      puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
    }
    dVar7 = (double)AlternateSeed(cg);
  }
  lVar20 = 0;
  lVar13 = 0;
  local_29a0 = cg;
  lVar14 = 0;
  if (0 < local_29b8) {
    lVar13 = local_29b8;
    lVar14 = local_29b8;
  }
  while (lVar13 != 0) {
    pEVar2 = cg->offsets;
    lVar3 = pEVar2[(long)dVar7 + 1];
    lVar4 = pEVar2[(long)dVar7];
    dist_parent_nbor._M_param._M_a = 0;
    lVar1 = (lVar3 - lVar4) + -1;
    lVar5 = pEVar2[(long)dVar7];
    dist_parent_nbor._M_param._M_b = lVar1;
    rVar8 = std::uniform_int_distribution<long>::operator()(&dist_parent_nbor,&mt);
    local_29c0 = (double)cg->nbors[rVar8 + lVar5];
    lVar16 = cg->offsets[(long)local_29c0 + 1] - cg->offsets[(long)local_29c0];
    dist_nbor._M_param._M_a = (long)dVar7;
    dist_nbor._M_param._M_b = (long)local_29c0;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
              (&edge_list,(OrderedEdge *)&dist_nbor);
    local_29a8 = dVar7;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&visited_vertex_set,(size_type)dVar7);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&visited_vertex_set,(size_type)local_29c0);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_edge_set,rVar8 + lVar5);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    if (lVar3 - lVar4 == 1) {
      dist_nbor._M_param._M_b = lVar16 + -1;
      dVar7 = local_29c0;
    }
    else {
      dVar22 = std::
               generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                         (&mt);
      dist_nbor._M_param._M_b = lVar16 + -1;
      dVar7 = local_29c0;
      if ((double)dist_nbor._M_param._M_b / (double)lVar1 <= dVar22) {
        dist_nbor._M_param._M_b = lVar1;
        dVar7 = local_29a8;
      }
    }
    this = local_29a0;
    dist_nbor._M_param._M_a = 0;
    lVar1 = local_29a0->offsets[(long)dVar7];
    rVar8 = std::uniform_int_distribution<long>::operator()(&dist_nbor,&mt);
    lVar3 = this->offsets[(long)dVar7];
    local_29c0 = dVar7;
    rVar9 = std::uniform_int_distribution<long>::operator()(&dist_nbor,&mt);
    __n_00 = rVar8 + lVar1;
    __n_01 = rVar9 + lVar3;
    sVar15 = this->nbors[__n_00];
    sVar10 = this->nbors[__n_01];
    __n = Escape::CGraph::getEdgeBinary(this,sVar15,sVar10);
    local_29a8 = (double)CONCAT71(local_29a8._1_7_,sVar15 != sVar10);
    local_29c1 = __n != 0xffffffffffffffff;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_vertex_set,sVar15);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_vertex_set,sVar10);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_edge_set,__n_00);
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_edge_set,__n_01);
    cg = local_29a0;
    *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    if (__n != 0xffffffffffffffff) {
      rVar25 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited_edge_set,__n);
      *rVar25._M_p = *rVar25._M_p | rVar25._M_mask;
    }
    lVar20 = lVar20 + (ulong)(local_29a8._0_1_ & local_29c1);
    lVar13 = lVar13 + -1;
    dVar7 = local_29c0;
  }
  if (params->normalization_count_available == true) {
    sVar10 = 0;
    sVar15 = 0;
    if (0 < (long)local_29b0) {
      sVar15 = local_29b0;
    }
    dVar7 = 0.0;
    for (; pEVar19 = local_2998, sVar15 != sVar10; sVar10 = sVar10 + 1) {
      lVar13 = cg->offsets[sVar10 + 1] - cg->offsets[sVar10];
      dVar7 = dVar7 + (double)((lVar13 + -1) * lVar13) * 0.5;
    }
  }
  else {
    dist_nbor._M_param._M_a = local_29b8;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&dist_nbor._M_param._M_b,
               &edge_list);
    pEVar19 = local_2998;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_28b8,&visited_edge_set);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_2890,&visited_vertex_set);
    local_2868 = 0;
    OrderedEdgeCollection::OrderedEdgeCollection(&local_2860,(OrderedEdgeCollection *)&dist_nbor);
    Parameters::Parameters(&local_27e8,params);
    DegreeSumSquare((Estimates *)&dist_parent_nbor,cg,&local_2860,&local_27e8,0x19);
    Parameters::~Parameters(&local_27e8);
    OrderedEdgeCollection::~OrderedEdgeCollection(&local_2860);
    local_29c0 = (double)dist_parent_nbor._M_param._M_a;
    OrderedEdgeCollection::~OrderedEdgeCollection((OrderedEdgeCollection *)&dist_nbor);
    dVar7 = local_29c0;
  }
  pEVar19->fraction_of_vertices_seen = 1.0;
  pEVar19->fraction_of_edges_seen = 1.0;
  pEVar19->query_complexity = 1.0;
  pEVar19->estimate = (((double)lVar20 / (double)local_29b8) * dVar7) / 3.0;
  dist_nbor._M_param._M_a = CONCAT71(dist_nbor._M_param._M_a._1_7_,1);
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._M_offset =
       visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  dVar11 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                     (__first,__last,(_Iter_equals_val<const_bool>)&dist_nbor);
  dist_nbor._M_param._M_a = CONCAT71(dist_nbor._M_param._M_a._1_7_,1);
  __first_00.super__Bit_iterator_base._8_8_ = 0;
  __first_00.super__Bit_iterator_base._M_p =
       visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  __last_00.super__Bit_iterator_base._M_offset =
       visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  dVar12 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                     (__first_00,__last_00,(_Iter_equals_val<const_bool>)&dist_nbor);
  auVar23._0_8_ = (double)dVar11 * 100.0;
  auVar23._8_8_ = (double)(lVar14 << 2) * 100.0;
  pEVar19->fraction_of_vertices_seen = ((double)dVar12 * 100.0) / (double)(long)local_29b0;
  auVar24._8_8_ = (double)(long)local_2990;
  auVar24._0_8_ = (double)(long)local_2990;
  auVar24 = divpd(auVar23,auVar24);
  pEVar19->fraction_of_edges_seen = (double)auVar24._0_8_;
  pEVar19->query_complexity = (double)auVar24._8_8_;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&visited_edge_set.super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&visited_vertex_set.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>::~_Vector_base
            (&edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>);
  std::random_device::~random_device(&rd);
  return pEVar19;
}

Assistant:

Estimates VertexMCMC(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    EdgeIdx count_tri = 0; // This variable counts the number of times we find a triangle
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    /**
     * Algorithm
     */
    parent = seed;
    deg_of_parent = cg->degree(parent); // degree of parent vertex
    if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
        parent = AlternateSeed(cg,mt);

    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the seed vertex
        deg_of_parent = cg->degree(parent); // degree of parent vertex
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        child = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
        deg_of_child = cg->degree(child);// degree of the child vertex

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[parent] = true;
        visited_vertex_set[child] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Decide if to take the step or stay put at the same vertex
         */
        bool accept;
        double acceptance_prob;
        if (deg_of_parent == 1)
            accept = true;
        else {
            acceptance_prob = (deg_of_child - 1) * 1.0 / (deg_of_parent - 1);
            std::bernoulli_distribution accpet_dist(acceptance_prob);
            accept = accpet_dist(mt);
        }
        if (accept) {
            parent = child;
            deg_of_parent = deg_of_child;
        }

        /**
         * Sample two nodes from the the neighborhood of parent. Call them u and v. Check if they form a triangle
         */
        std::uniform_int_distribution<VertexIdx> dist_nbor(0, deg_of_parent - 1);
        EdgeIdx random_nbor_edge_u = cg->offsets[parent] + dist_nbor(mt); // TODO: check randomness. same seeding ok?
        EdgeIdx random_nbor_edge_v = cg->offsets[parent] + dist_nbor(mt);
        no_of_query = no_of_query + 2; // Two queries to the uniform random neighbor oracle
        VertexIdx u = cg->nbors[random_nbor_edge_u];
        VertexIdx v = cg->nbors[random_nbor_edge_v];
        EdgeIdx e = cg->getEdgeBinary(u,v);
        no_of_query++; // One query to the edge oracle
        if( u!=v && e != -1) {// parent,u,v forms a triangle
            count_tri++;
        }

        /**
         * Update data structures
         */
        visited_vertex_set[u] = true;
        visited_vertex_set[v] = true;
        visited_edge_set[random_nbor_edge_u] = true;
        visited_edge_set[random_nbor_edge_v] = true;
        if (e!= -1)
            visited_edge_set[e] =true;

    }

    /**
     * Estimate the number of wedge count. This will be used in the triangle estimation.
     */
    double wedge_count = 0;
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates degree_sum_sq_output = DegreeSumSquare(cg, randomEdgeCollection, params, skip);
        wedge_count = degree_sum_sq_output.estimate;
    }
    else {
        for (VertexIdx src=0; src < n; src++) {
            VertexIdx deg = cg->degree(src);
            wedge_count += deg * (deg-1) * 0.5;
        }
    }

    double transitivity = 1.0*count_tri / walk_length;
    double triangleEstimate = transitivity * wedge_count / 3.0 ;

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query *100.0 /m;

    return return_estimate;
}